

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatImage.cpp
# Opt level: O2

void __thiscall
nv::FloatImage::scaleBias(FloatImage *this,uint base_component,uint num,float scale,float bias)

{
  float *pfVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  uint i;
  ulong uVar5;
  
  uVar2 = (uint)this->m_height * (uint)this->m_width;
  pfVar1 = this->m_mem;
  uVar4 = uVar2 * base_component;
  for (uVar3 = 0; uVar3 != num; uVar3 = uVar3 + 1) {
    for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
      pfVar1[uVar4 + uVar5] = (pfVar1[uVar4 + uVar5] + bias) * scale;
    }
    uVar4 = uVar4 + uVar2;
  }
  return;
}

Assistant:

void FloatImage::scaleBias(uint base_component, uint num, float scale, float bias)
{
	const uint size = m_width * m_height;
	
	for(uint c = 0; c < num; c++) {
		float * ptr = this->channel(base_component + c);
		
		for(uint i = 0; i < size; i++) {
			ptr[i] = scale * (ptr[i] + bias);
		}
	}
}